

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_fma.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct_x86_fma::create_pipeline(InnerProduct_x86_fma *this,Option *opt)

{
  Mat *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  uint _h;
  _func_int *p_Var13;
  void *pvVar14;
  size_t sVar15;
  int *piVar16;
  Allocator *pAVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  undefined8 uVar23;
  int iVar24;
  uint _w;
  Layer *pLVar25;
  undefined4 *puVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  char cVar31;
  uint uVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined4 *puVar42;
  long lVar43;
  long lVar44;
  Mat *this_01;
  long lVar45;
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  ParamDict pd;
  long local_128;
  long local_120;
  uint local_e8;
  long local_d0;
  long local_c8;
  Mat local_b8;
  long local_70;
  void *local_68;
  long local_60;
  ulong local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  
  pLVar25 = create_layer(0xe);
  this->flatten = pLVar25;
  ParamDict::ParamDict((ParamDict *)&local_b8);
  (*this->flatten->_vptr_Layer[2])(this->flatten,&local_b8);
  (*this->flatten->_vptr_Layer[4])(this->flatten,opt);
  ParamDict::~ParamDict((ParamDict *)&local_b8);
  if ((opt->use_int8_inference == true) &&
     (*(long *)(&this->field_0x140 + (long)this->_vptr_InnerProduct_x86_fma[-3]) == 1)) {
    create_pipeline_int8_x86(this,opt);
  }
  else {
    iVar24 = cpu_support_x86_f16c();
    if ((iVar24 == 0) || (opt->use_fp16_storage != true)) {
      p_Var13 = this->_vptr_InnerProduct_x86_fma[-3];
      _h = *(uint *)(&this->field_0xd0 + (long)p_Var13);
      _w = *(int *)(&this->field_0xd8 + (long)p_Var13) / (int)_h;
      cVar31 = '\x01';
      if (opt->use_packing_layout == true) {
        cVar31 = '\b';
        if ((_h & 7) != 0) {
          cVar31 = ((_h & 3) == 0) * '\x03' + '\x01';
        }
      }
      this_01 = (Mat *)(&this->field_0x130 + (long)p_Var13);
      this_00 = &this->weight_data_tm;
      if (cVar31 == '\x01') {
        if (p_Var13 != (_func_int *)0xfffffffffffffee0) {
          piVar16 = *(int **)(&this->field_0x138 + (long)p_Var13);
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + 1;
            UNLOCK();
          }
          piVar16 = (this->weight_data_tm).refcount;
          if (piVar16 != (int *)0x0) {
            LOCK();
            *piVar16 = *piVar16 + -1;
            UNLOCK();
            if (*piVar16 == 0) {
              pvVar14 = (this->weight_data_tm).data;
              pAVar17 = (this->weight_data_tm).allocator;
              if (pAVar17 == (Allocator *)0x0) {
                if (pvVar14 != (void *)0x0) {
                  free(pvVar14);
                }
              }
              else {
                (*pAVar17->_vptr_Allocator[3])();
              }
            }
          }
          (this->weight_data_tm).cstep = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).refcount + 4) = 0;
          *(undefined8 *)((long)&(this->weight_data_tm).elemsize + 4) = 0;
          this_00->data = (void *)0x0;
          (this->weight_data_tm).refcount = (int *)0x0;
          (this->weight_data_tm).dims = 0;
          (this->weight_data_tm).w = 0;
          (this->weight_data_tm).h = 0;
          (this->weight_data_tm).d = 0;
          (this->weight_data_tm).c = 0;
          piVar16 = *(int **)(&this->field_0x138 + (long)p_Var13);
          (this->weight_data_tm).data = this_01->data;
          (this->weight_data_tm).refcount = piVar16;
          (this->weight_data_tm).elemsize = *(size_t *)(&this->field_0x140 + (long)p_Var13);
          (this->weight_data_tm).elempack = *(int *)(&this->field_0x148 + (long)p_Var13);
          (this->weight_data_tm).allocator = *(Allocator **)(&this->field_0x150 + (long)p_Var13);
          uVar22 = *(undefined8 *)(&this->field_0x158 + (long)p_Var13);
          uVar23 = *(undefined8 *)(&this->field_0x160 + (long)p_Var13);
          (this->weight_data_tm).dims = (int)uVar22;
          (this->weight_data_tm).w = (int)((ulong)uVar22 >> 0x20);
          (this->weight_data_tm).h = (int)uVar23;
          (this->weight_data_tm).d = (int)((ulong)uVar23 >> 0x20);
          (this->weight_data_tm).c = *(int *)(&this->field_0x168 + (long)p_Var13);
          (this->weight_data_tm).cstep = *(size_t *)(&this->field_0x170 + (long)p_Var13);
        }
      }
      else if (cVar31 == '\x04') {
        Mat::reshape(&local_b8,this_01,_w,_h,(Allocator *)0x0);
        uVar32 = _h + 3;
        if (-1 < (int)_h) {
          uVar32 = _h;
        }
        Mat::create(this_00,_w,(int)uVar32 >> 2,0x10,4,(Allocator *)0x0);
        if (3 < (int)_h) {
          local_e8 = _w & 0xfffffffc;
          lVar38 = 3;
          lVar37 = 2;
          local_120 = 1;
          local_128 = 0;
          uVar27 = 0;
          do {
            lVar40 = (long)(this->weight_data_tm).w;
            pvVar14 = (this->weight_data_tm).data;
            sVar15 = (this->weight_data_tm).elemsize;
            puVar26 = (undefined4 *)((uVar27 >> 2) * lVar40 * sVar15 + (long)pvVar14);
            lVar39 = (long)local_b8.w;
            if ((int)_w < 4) {
              lVar39 = local_b8.elemsize * lVar39;
              lVar33 = lVar39 * uVar27;
              lVar35 = (uVar27 | 1) * lVar39;
              lVar43 = (uVar27 | 2) * lVar39;
              lVar41 = lVar39 * (uVar27 | 3);
              uVar32 = 0;
            }
            else {
              lVar41 = local_b8.elemsize * lVar38 * lVar39;
              lVar43 = local_b8.elemsize * lVar37 * lVar39;
              lVar35 = local_b8.elemsize * local_120 * lVar39;
              lVar39 = local_b8.elemsize * uVar27 * lVar39;
              iVar24 = 3;
              lVar33 = 0;
              do {
                puVar42 = puVar26;
                auVar1 = *(undefined1 (*) [16])((long)local_b8.data + lVar33 + lVar39);
                auVar2 = *(undefined1 (*) [16])((long)local_b8.data + lVar33 + lVar35);
                auVar3 = *(undefined1 (*) [16])((long)local_b8.data + lVar33 + lVar43);
                auVar4 = *(undefined1 (*) [16])((long)local_b8.data + lVar33 + lVar41);
                auVar19 = vunpcklps_avx(auVar1,auVar2);
                auVar20 = vunpcklps_avx(auVar3,auVar4);
                auVar18 = vunpckhps_avx(auVar1,auVar2);
                auVar4 = vunpckhps_avx(auVar3,auVar4);
                auVar1 = vmovlhps_avx(auVar19,auVar20);
                auVar3 = vunpckhpd_avx(auVar19,auVar20);
                auVar2 = vmovlhps_avx(auVar18,auVar4);
                auVar4 = vunpckhpd_avx(auVar18,auVar4);
                puVar26 = (undefined4 *)
                          ((long)pvVar14 + lVar33 * 4 + sVar15 * local_128 * lVar40 + 0x40);
                *(undefined1 (*) [16])(puVar26 + -0x10) = auVar1;
                *(undefined1 (*) [16])(puVar26 + -0xc) = auVar3;
                *(undefined1 (*) [16])(puVar26 + -8) = auVar2;
                *(undefined1 (*) [16])(puVar26 + -4) = auVar4;
                iVar24 = iVar24 + 4;
                lVar33 = lVar33 + 0x10;
              } while (iVar24 < (int)_w);
              puVar26 = puVar42 + 0x10;
              lVar41 = lVar41 + lVar33;
              lVar43 = lVar43 + lVar33;
              lVar35 = lVar35 + lVar33;
              lVar33 = lVar39 + lVar33;
              uVar32 = local_e8;
            }
            if ((int)uVar32 < (int)_w) {
              lVar39 = 0;
              do {
                *puVar26 = *(undefined4 *)((long)local_b8.data + lVar39 * 4 + lVar33);
                puVar26[1] = *(undefined4 *)((long)local_b8.data + lVar39 * 4 + lVar35);
                puVar26[2] = *(undefined4 *)((long)local_b8.data + lVar39 * 4 + lVar43);
                puVar26[3] = *(undefined4 *)((long)local_b8.data + lVar39 * 4 + lVar41);
                puVar26 = puVar26 + 4;
                lVar39 = lVar39 + 1;
              } while (_w - uVar32 != (int)lVar39);
            }
            uVar30 = uVar27 + 7;
            lVar38 = lVar38 + 4;
            lVar37 = lVar37 + 4;
            local_120 = local_120 + 4;
            local_128 = local_128 + 1;
            uVar27 = uVar27 + 4;
          } while (uVar30 < _h);
        }
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      else if (cVar31 == '\b') {
        Mat::reshape(&local_b8,this_01,_w,_h,(Allocator *)0x0);
        uVar32 = _h + 7;
        if (-1 < (int)_h) {
          uVar32 = _h;
        }
        Mat::create(this_00,_w,(int)uVar32 >> 3,0x20,8,(Allocator *)0x0);
        if (7 < (int)_h) {
          lVar39 = 1;
          lVar40 = 2;
          lVar38 = 7;
          lVar41 = 6;
          lVar43 = 5;
          local_c8 = 4;
          local_d0 = 3;
          uVar27 = 0;
          lVar37 = 0;
          do {
            local_38 = lVar37;
            lVar37 = (long)(this->weight_data_tm).w;
            pvVar14 = (this->weight_data_tm).data;
            sVar15 = (this->weight_data_tm).elemsize;
            puVar26 = (undefined4 *)((uVar27 >> 3) * lVar37 * sVar15 + (long)pvVar14);
            lVar35 = (long)local_b8.w;
            if ((int)_w < 8) {
              lVar35 = local_b8.elemsize * lVar35;
              lVar37 = lVar35 * uVar27;
              lVar33 = (uVar27 | 1) * lVar35;
              lVar34 = (uVar27 | 2) * lVar35;
              lVar36 = (uVar27 | 3) * lVar35;
              lVar29 = (uVar27 | 4) * lVar35;
              lVar28 = (uVar27 | 5) * lVar35;
              lVar44 = (uVar27 | 6) * lVar35;
              lVar45 = lVar35 * (uVar27 | 7);
              uVar32 = 0;
            }
            else {
              lVar37 = sVar15 * local_38 * lVar37;
              local_60 = local_b8.elemsize * uVar27 * lVar35;
              lVar33 = local_b8.elemsize * lVar39 * lVar35;
              lVar34 = local_b8.elemsize * lVar40 * lVar35;
              local_70 = local_b8.elemsize * lVar38 * lVar35;
              lVar44 = local_b8.elemsize * lVar41 * lVar35;
              lVar28 = local_b8.elemsize * lVar43 * lVar35;
              lVar29 = local_b8.elemsize * local_c8 * lVar35;
              lVar35 = local_b8.elemsize * local_d0 * lVar35;
              local_68 = local_b8.data;
              iVar24 = 7;
              lVar36 = 0;
              do {
                auVar5 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + local_60);
                auVar6 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar33);
                auVar7 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar34);
                auVar8 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar35);
                auVar9 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar29);
                auVar10 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar28);
                auVar11 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + lVar44);
                auVar12 = *(undefined1 (*) [32])((long)local_b8.data + lVar36 + local_70);
                auVar21 = vunpcklps_avx(auVar5,auVar6);
                auVar6 = vunpckhps_avx(auVar5,auVar6);
                auVar5 = vunpcklps_avx(auVar7,auVar8);
                auVar7 = vunpckhps_avx(auVar7,auVar8);
                auVar46 = vunpcklps_avx(auVar9,auVar10);
                auVar8 = vunpckhps_avx(auVar9,auVar10);
                auVar47 = vunpcklps_avx(auVar11,auVar12);
                auVar9 = vunpckhps_avx(auVar11,auVar12);
                auVar10 = vunpcklpd_avx(auVar21,auVar5);
                auVar5 = vunpckhpd_avx(auVar21,auVar5);
                auVar11 = vunpcklpd_avx(auVar6,auVar7);
                auVar6 = vunpckhpd_avx(auVar6,auVar7);
                auVar12 = vunpcklpd_avx(auVar46,auVar47);
                auVar7 = vunpckhpd_avx(auVar46,auVar47);
                auVar21 = vunpcklpd_avx(auVar8,auVar9);
                auVar8 = vunpckhpd_avx(auVar8,auVar9);
                auVar46._16_16_ = auVar12._0_16_;
                auVar46._0_16_ = auVar10._0_16_;
                auVar47._16_16_ = auVar7._0_16_;
                auVar47._0_16_ = auVar5._0_16_;
                auVar48._16_16_ = auVar21._0_16_;
                auVar48._0_16_ = auVar11._0_16_;
                auVar49._16_16_ = auVar8._0_16_;
                auVar49._0_16_ = auVar6._0_16_;
                auVar9 = vperm2f128_avx(auVar10,auVar12,0x31);
                auVar5 = vperm2f128_avx(auVar5,auVar7,0x31);
                auVar7 = vperm2f128_avx(auVar11,auVar21,0x31);
                auVar6 = vperm2f128_avx(auVar6,auVar8,0x31);
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37) = auVar46;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0x20) = auVar47;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0x40) = auVar48;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0x60) = auVar49;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0x80) = auVar9;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0xa0) = auVar5;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0xc0) = auVar7;
                *(undefined1 (*) [32])((long)pvVar14 + lVar36 * 8 + lVar37 + 0xe0) = auVar6;
                puVar26 = puVar26 + 0x40;
                lVar36 = lVar36 + 0x20;
                iVar24 = iVar24 + 8;
              } while (iVar24 < (int)_w);
              lVar37 = local_60 + lVar36;
              lVar33 = lVar33 + lVar36;
              lVar34 = lVar34 + lVar36;
              lVar45 = local_70 + lVar36;
              lVar44 = lVar44 + lVar36;
              lVar28 = lVar28 + lVar36;
              lVar29 = lVar29 + lVar36;
              lVar36 = lVar35 + lVar36;
              uVar32 = _w & 0xfffffff8;
              local_58 = uVar27;
              local_50 = lVar41;
              local_48 = lVar40;
              local_40 = lVar39;
            }
            if ((int)uVar32 < (int)_w) {
              lVar35 = 0;
              do {
                *puVar26 = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar37);
                puVar26[1] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar33);
                puVar26[2] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar34);
                puVar26[3] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar36);
                puVar26[4] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar29);
                puVar26[5] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar28);
                puVar26[6] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar44);
                puVar26[7] = *(undefined4 *)((long)local_b8.data + lVar35 * 4 + lVar45);
                puVar26 = puVar26 + 8;
                lVar35 = lVar35 + 1;
              } while (_w - uVar32 != (int)lVar35);
            }
            uVar30 = uVar27 + 0xf;
            lVar39 = lVar39 + 8;
            lVar40 = lVar40 + 8;
            lVar38 = lVar38 + 8;
            lVar41 = lVar41 + 8;
            lVar43 = lVar43 + 8;
            local_c8 = local_c8 + 8;
            local_d0 = local_d0 + 8;
            uVar27 = uVar27 + 8;
            lVar37 = local_38 + 1;
          } while (uVar30 < _h);
        }
        if (local_b8.refcount != (int *)0x0) {
          LOCK();
          *local_b8.refcount = *local_b8.refcount + -1;
          UNLOCK();
          if (*local_b8.refcount == 0) {
            if (local_b8.allocator == (Allocator *)0x0) {
              if (local_b8.data != (void *)0x0) {
                free(local_b8.data);
              }
            }
            else {
              (*(local_b8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        p_Var13 = this->_vptr_InnerProduct_x86_fma[-3];
        piVar16 = *(int **)(&this->field_0x138 + (long)p_Var13);
        if (piVar16 != (int *)0x0) {
          LOCK();
          *piVar16 = *piVar16 + -1;
          UNLOCK();
          if (*piVar16 == 0) {
            if (*(long **)(&this->field_0x150 + (long)p_Var13) == (long *)0x0) {
              if (*(void **)(&this->field_0x130 + (long)p_Var13) != (void *)0x0) {
                free(*(void **)(&this->field_0x130 + (long)p_Var13));
              }
            }
            else {
              (**(code **)(**(long **)(&this->field_0x150 + (long)p_Var13) + 0x18))();
            }
          }
        }
        *(undefined8 *)(&this->field_0x170 + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x13c + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x144 + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x130 + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x138 + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x158 + (long)p_Var13) = 0;
        *(undefined8 *)(&this->field_0x160 + (long)p_Var13) = 0;
        *(undefined4 *)(&this->field_0x168 + (long)p_Var13) = 0;
      }
    }
    else {
      create_pipeline_fp16s(this,opt);
    }
  }
  return 0;
}

Assistant:

int InnerProduct_x86_fma::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return create_pipeline_fp16s(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
    {
        weight_data.release();
    }

    return 0;
}